

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool duckdb::MultiplyPropagateStatistics::Operation<int,duckdb::TryDecimalMultiply>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  int64_t in_RDX;
  LogicalType *in_RSI;
  int result;
  idx_t r;
  idx_t l;
  int max;
  int min;
  int rvals [2];
  int lvals [2];
  Value *in_stack_ffffffffffffff18;
  int32_t in_stack_ffffffffffffff20;
  int32_t in_stack_ffffffffffffff24;
  BaseStatistics *in_stack_ffffffffffffff70;
  int local_5c;
  ulong local_58;
  ulong local_50;
  int local_48;
  int local_44;
  
  NumericStats::GetMin<int>(in_stack_ffffffffffffff70);
  NumericStats::GetMax<int>(in_stack_ffffffffffffff70);
  NumericStats::GetMin<int>(in_stack_ffffffffffffff70);
  NumericStats::GetMax<int>(in_stack_ffffffffffffff70);
  local_44 = NumericLimits<int>::Maximum();
  local_48 = NumericLimits<int>::Minimum();
  local_50 = 0;
  do {
    if (1 < local_50) {
      Value::Numeric(in_RSI,in_RDX);
      Value::operator=((Value *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff18);
      Value::~Value((Value *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      Value::Numeric(in_RSI,in_RDX);
      Value::operator=((Value *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff18);
      Value::~Value((Value *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      return false;
    }
    for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
      bVar1 = TryDecimalMultiply::Operation<int,int,int>
                        (in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                         (int32_t *)in_stack_ffffffffffffff18);
      if (!bVar1) {
        return true;
      }
      if (local_5c < local_44) {
        local_44 = local_5c;
      }
      if (local_48 < local_5c) {
        local_48 = local_5c;
      }
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}